

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

size_t __thiscall clickhouse::SocketInput::DoRead(SocketInput *this,void *buf,size_t len)

{
  size_t sVar1;
  error_category *__ecat;
  int *piVar2;
  undefined8 uVar3;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  ssize_t ret;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar4;
  error_category *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  error_category *peVar5;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar6;
  undefined4 in_stack_ffffffffffffffd4;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  sVar1 = recv(*(int *)(in_RDI + 8),in_RSI,(long)in_EDX,0);
  if (0 < (long)sVar1) {
    return sVar1;
  }
  if (sVar1 == 0) {
    __ecat = (error_category *)__cxa_allocate_exception(0x20);
    peVar5 = __ecat;
    piVar2 = __errno_location();
    iVar4 = (int)((ulong)peVar5 >> 0x20);
    iVar6 = *piVar2;
    std::_V2::system_category();
    std::system_error::system_error
              ((system_error *)CONCAT44(in_stack_ffffffffffffffd4,iVar6),iVar4,__ecat,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    __cxa_throw(__ecat,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  uVar3 = __cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  iVar4 = *piVar2;
  std::_V2::system_category();
  std::system_error::system_error
            ((system_error *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),iVar6,
             in_stack_ffffffffffffffc0,(char *)CONCAT44(iVar4,in_stack_ffffffffffffffb8));
  __cxa_throw(uVar3,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

size_t SocketInput::DoRead(void* buf, size_t len) {
    const ssize_t ret = ::recv(s_, (char*)buf, (int)len, 0);

    if (ret > 0) {
        return (size_t)ret;
    }

    if (ret == 0) {
        throw std::system_error(
            errno, std::system_category(), "closed"
        );
    }

    throw std::system_error(
        errno, std::system_category(), "can't receive string data"
    );
}